

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O0

int __thiscall tt::net::Epoll::poll(Epoll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int __epfd;
  epoll_event *__events;
  size_type sVar1;
  __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_> local_28
  ;
  int local_1c;
  pollfd *ppStack_18;
  int event_count;
  Epoll *this_local;
  vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  *req_data;
  
  ppStack_18 = __fds;
  this_local = this;
  while( true ) {
    __epfd = __fds->fd;
    local_28._M_current =
         (epoll_event *)
         std::vector<epoll_event,_std::allocator<epoll_event>_>::begin
                   ((vector<epoll_event,_std::allocator<epoll_event>_> *)(__fds + 1));
    __events = (epoll_event *)
               __gnu_cxx::
               __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_>
               ::operator*(&local_28);
    sVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size
                      ((vector<epoll_event,_std::allocator<epoll_event>_> *)(__fds + 1));
    local_1c = epoll_wait(__epfd,__events,(int)sVar1,10000);
    if (local_1c < 0) {
      perror("epoll wait error");
    }
    getEventsRequest((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
                      *)this,(Epoll *)__fds,local_1c);
    sVar1 = std::
            vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
            ::size((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
                    *)this);
    if (sVar1 != 0) break;
    std::
    vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>::
    ~vector((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
             *)this);
  }
  return (int)this;
}

Assistant:

std::vector<SP_Channel> Epoll::poll(){
	
	while(true){
		
		int event_count = 
			epoll_wait(m_epollFd, &*m_events.begin(),m_events.size(), EPOLLWAIT_TIME);
	
		if(event_count < 0) perror("epoll wait error");

		std::vector<SP_Channel> req_data = getEventsRequest(event_count);

		if(req_data.size() > 0) return req_data;
	}
}